

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pSVar6;
  pointer pSVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar8;
  pointer pSVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar4 = this->cap;
  if (uVar12 < uVar4 * 2) {
    uVar12 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar13 = (long)pos - (long)this->data_;
  pSVar7 = (pointer)operator_new(uVar12 << 4);
  uVar3 = (args->super_SVIntStorage).bitWidth;
  bVar1 = (args->super_SVIntStorage).signFlag;
  bVar2 = (args->super_SVIntStorage).unknownFlag;
  *(undefined8 *)((long)pSVar7 + lVar13) = 0;
  *(uint *)((long)pSVar7 + lVar13 + 8) = uVar3;
  *(bool *)((long)pSVar7 + lVar13 + 0xc) = bVar1;
  *(bool *)((long)pSVar7 + lVar13 + 0xd) = bVar2;
  if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
    aVar8 = (args->super_SVIntStorage).field_0;
  }
  else {
    aVar8 = (args->super_SVIntStorage).field_0;
    (args->super_SVIntStorage).field_0.val = 0;
  }
  (((pointer)((long)pSVar7 + lVar13))->super_SVIntStorage).field_0 = aVar8;
  pSVar9 = this->data_;
  sVar5 = this->len;
  ctx = (EVP_PKEY_CTX *)(pSVar9 + sVar5);
  pSVar6 = pSVar7;
  if (ctx == (EVP_PKEY_CTX *)pos) {
    if (sVar5 != 0) {
      lVar11 = 0;
      do {
        uVar3 = *(uint *)((long)&(pSVar9->super_SVIntStorage).bitWidth + lVar11);
        bVar1 = (&(pSVar9->super_SVIntStorage).signFlag)[lVar11];
        bVar2 = (&(pSVar9->super_SVIntStorage).unknownFlag)[lVar11];
        *(undefined8 *)((long)&(pSVar7->super_SVIntStorage).field_0 + lVar11) = 0;
        *(uint *)((long)&(pSVar7->super_SVIntStorage).bitWidth + lVar11) = uVar3;
        (&(pSVar7->super_SVIntStorage).signFlag)[lVar11] = bVar1;
        (&(pSVar7->super_SVIntStorage).unknownFlag)[lVar11] = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          ctx = *(EVP_PKEY_CTX **)((long)&(pSVar9->super_SVIntStorage).field_0 + lVar11);
        }
        else {
          ctx = *(EVP_PKEY_CTX **)((long)&(pSVar9->super_SVIntStorage).field_0 + lVar11);
          *(undefined8 *)((long)&(pSVar9->super_SVIntStorage).field_0 + lVar11) = 0;
        }
        *(EVP_PKEY_CTX **)((long)&(pSVar7->super_SVIntStorage).field_0 + lVar11) = ctx;
        lVar11 = lVar11 + 0x10;
      } while (sVar5 * 0x10 != lVar11);
    }
  }
  else {
    for (; pSVar9 != pos; pSVar9 = pSVar9 + 1) {
      uVar3 = (pSVar9->super_SVIntStorage).bitWidth;
      bVar1 = (pSVar9->super_SVIntStorage).signFlag;
      bVar2 = (pSVar9->super_SVIntStorage).unknownFlag;
      (pSVar6->super_SVIntStorage).field_0.val = 0;
      (pSVar6->super_SVIntStorage).bitWidth = uVar3;
      (pSVar6->super_SVIntStorage).signFlag = bVar1;
      (pSVar6->super_SVIntStorage).unknownFlag = bVar2;
      if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
        ctx = (EVP_PKEY_CTX *)(pSVar9->super_SVIntStorage).field_0.val;
      }
      else {
        ctx = (EVP_PKEY_CTX *)(pSVar9->super_SVIntStorage).field_0.val;
        (pSVar9->super_SVIntStorage).field_0.val = 0;
      }
      (pSVar6->super_SVIntStorage).field_0.val = (uint64_t)ctx;
      pSVar6 = pSVar6 + 1;
    }
    pSVar9 = this->data_;
    if (pSVar9 + sVar5 != pos) {
      pbVar10 = (byte *)((long)pSVar7 + lVar13 + 0x1d);
      do {
        uVar3 = (pos->super_SVIntStorage).bitWidth;
        bVar1 = (pos->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pos->super_SVIntStorage).unknownFlag;
        pbVar10[-0xd] = 0;
        pbVar10[-0xc] = 0;
        pbVar10[-0xb] = 0;
        pbVar10[-10] = 0;
        pbVar10[-9] = 0;
        pbVar10[-8] = 0;
        pbVar10[-7] = 0;
        pbVar10[-6] = 0;
        *(uint *)(pbVar10 + -5) = uVar3;
        pbVar10[-1] = bVar1;
        *pbVar10 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar8 = (pos->super_SVIntStorage).field_0;
        }
        else {
          aVar8 = (pos->super_SVIntStorage).field_0;
          (pos->super_SVIntStorage).field_0.val = 0;
        }
        *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(pbVar10 + -0xd) = aVar8;
        pos = pos + 1;
        pbVar10 = pbVar10 + 0x10;
      } while (pos != pSVar9 + sVar5);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pSVar7;
  return (pointer)((long)pSVar7 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}